

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O2

bool __thiscall COLLADASaxFWL::NodeLoader::data__skeleton(NodeLoader *this,URI *value)

{
  if (this->mCurrentInstanceControllerData != (InstanceControllerData *)0x0) {
    std::__cxx11::list<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>::push_back
              (&this->mCurrentInstanceControllerData->skeletonRoots,value);
    std::vector<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>::push_back
              (&this->mCurrentInstanceControllerData->instanceController->mSkeletons,value);
  }
  return true;
}

Assistant:

bool NodeLoader::data__skeleton( COLLADABU::URI value )
	{
		if (mCurrentInstanceControllerData)
		{
			mCurrentInstanceControllerData->skeletonRoots.push_back( value );
            mCurrentInstanceControllerData->instanceController->skeletons().push_back( value );
		}

		return true;
	}